

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_client.c
# Opt level: O0

OSSL_HTTP_REQ_CTX *
OSSL_HTTP_open(char *server,char *port,char *proxy,char *no_proxy,int use_ssl,BIO *bio,BIO *rbio,
              OSSL_HTTP_bio_cb_t bio_update_fn,void *arg,int buf_size,int overall_timeout)

{
  int iVar1;
  char *pcVar2;
  BIO *pBVar3;
  long in_RCX;
  long in_RDX;
  char *in_RSI;
  char *in_RDI;
  int in_R8D;
  BIO *in_R9;
  BIO *in_stack_00000008;
  undefined4 in_stack_00000010;
  undefined4 in_stack_00000014;
  undefined8 in_stack_00000018;
  undefined4 in_stack_00000020;
  undefined4 in_stack_00000028;
  BIO *orig_bio;
  char *proxy_port;
  char *proxy_host;
  OSSL_HTTP_REQ_CTX *rctx;
  BIO *cbio;
  char *in_stack_ffffffffffffff48;
  char *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  int in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  BIO *in_stack_ffffffffffffff78;
  BIO *pBVar4;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  char **in_stack_ffffffffffffff88;
  BIO *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  char **in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffc0;
  char *local_28;
  OSSL_HTTP_REQ_CTX *local_18;
  
  local_18 = (OSSL_HTTP_REQ_CTX *)0x0;
  if ((in_R8D == 0) || (CONCAT44(in_stack_00000014,in_stack_00000010) != 0)) {
    if ((in_stack_00000008 == (BIO *)0x0) ||
       ((in_R9 != (BIO *)0x0 && (CONCAT44(in_stack_00000014,in_stack_00000010) == 0)))) {
      pBVar4 = in_R9;
      local_28 = in_RSI;
      if (in_R9 == (BIO *)0x0) {
        in_stack_ffffffffffffffa0 = (char *)0x0;
        in_stack_ffffffffffffff98 = (char *)0x0;
        if (in_RDI == (char *)0x0) {
          ERR_new();
          ERR_set_debug((char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                        (int)((ulong)in_stack_ffffffffffffff58 >> 0x20),in_stack_ffffffffffffff50);
          ERR_set_error(0x3d,0xc0102,(char *)0x0);
          return (OSSL_HTTP_REQ_CTX *)0x0;
        }
        if ((in_RSI != (char *)0x0) && (*in_RSI == '\0')) {
          local_28 = (char *)0x0;
        }
        if (((local_28 == (char *)0x0) &&
            (pcVar2 = strchr(in_RDI,0x3a), pBVar4 = in_R9, pcVar2 == (char *)0x0)) &&
           (local_28 = "80", in_R8D != 0)) {
          local_28 = "443";
        }
        pcVar2 = OSSL_HTTP_adapt_proxy
                           (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                            in_stack_ffffffffffffff48,0);
        if (pcVar2 != (char *)0x0) {
          in_stack_ffffffffffffff58 = (char *)0x0;
          iVar1 = OSSL_HTTP_parse_url(in_stack_ffffffffffffff98,(int *)in_stack_ffffffffffffff90,
                                      in_stack_ffffffffffffff88,
                                      (char **)CONCAT44(in_stack_ffffffffffffff84,
                                                        in_stack_ffffffffffffff80),
                                      (char **)in_stack_ffffffffffffff78,
                                      (int *)CONCAT44(in_stack_ffffffffffffff74,
                                                      in_stack_ffffffffffffff70),
                                      in_stack_ffffffffffffffb0,(char **)pBVar4,
                                      (char **)CONCAT44(in_R8D,in_stack_ffffffffffffffc0));
          if (iVar1 == 0) {
            return (OSSL_HTTP_REQ_CTX *)0x0;
          }
        }
        in_R9 = http_new_bio((char *)in_stack_ffffffffffffff78,
                             (char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                             in_stack_ffffffffffffff6c,
                             (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                             in_stack_ffffffffffffff58);
        CRYPTO_free(in_stack_ffffffffffffffa0);
        CRYPTO_free(in_stack_ffffffffffffff98);
        if (in_R9 == (BIO *)0x0) {
          return (OSSL_HTTP_REQ_CTX *)0x0;
        }
      }
      else if ((in_RDX != 0) || (in_RCX != 0)) {
        ERR_new();
        ERR_set_debug((char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                      (int)((ulong)in_stack_ffffffffffffff58 >> 0x20),in_stack_ffffffffffffff50);
        ERR_set_error(0x3d,0x80106,(char *)0x0);
        return (OSSL_HTTP_REQ_CTX *)0x0;
      }
      ERR_set_mark();
      if ((in_stack_00000008 == (BIO *)0x0) &&
         (iVar1 = BIO_do_connect_retry
                            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                             in_stack_ffffffffffffff70), iVar1 < 1)) {
        if (pBVar4 == (BIO *)0x0) {
          BIO_free_all((BIO *)in_R9);
        }
      }
      else {
        pBVar3 = in_R9;
        if ((CONCAT44(in_stack_00000014,in_stack_00000010) == 0) ||
           (pBVar3 = (BIO *)(*(code *)CONCAT44(in_stack_00000014,in_stack_00000010))
                                      (in_R9,in_stack_00000018,1,in_R8D),
           in_stack_ffffffffffffff90 = in_R9, pBVar3 != (BIO *)0x0)) {
          pBVar4 = pBVar3;
          if (in_stack_00000008 != (BIO *)0x0) {
            pBVar4 = in_stack_00000008;
          }
          local_18 = http_req_ctx_new((int)((ulong)pBVar4 >> 0x20),
                                      (BIO *)CONCAT44(in_stack_ffffffffffffff74,
                                                      in_stack_ffffffffffffff70),
                                      (BIO *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_00000028),
                                      (OSSL_HTTP_bio_cb_t)
                                      CONCAT44(in_stack_ffffffffffffff64,in_stack_00000020),local_28
                                      ,(int)((ulong)in_RDI >> 0x20),
                                      (char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff98,
                                      in_stack_ffffffffffffffa0,(int)local_18,(int)pBVar3);
        }
        else if (pBVar4 == (BIO *)0x0) {
          BIO_free_all((BIO *)in_R9);
        }
      }
      if (local_18 == (OSSL_HTTP_REQ_CTX *)0x0) {
        ERR_clear_last_mark();
      }
      else {
        ERR_pop_to_mark();
      }
    }
    else {
      ERR_new();
      ERR_set_debug((char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                    (int)((ulong)in_stack_ffffffffffffff58 >> 0x20),in_stack_ffffffffffffff50);
      ERR_set_error(0x3d,0x80106,(char *)0x0);
      local_18 = (OSSL_HTTP_REQ_CTX *)0x0;
    }
  }
  else {
    ERR_new();
    ERR_set_debug((char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                  (int)((ulong)in_stack_ffffffffffffff58 >> 0x20),in_stack_ffffffffffffff50);
    ERR_set_error(0x3d,0x6b,(char *)0x0);
    local_18 = (OSSL_HTTP_REQ_CTX *)0x0;
  }
  return local_18;
}

Assistant:

OSSL_HTTP_REQ_CTX *OSSL_HTTP_open(const char *server, const char *port,
                                  const char *proxy, const char *no_proxy,
                                  int use_ssl, BIO *bio, BIO *rbio,
                                  OSSL_HTTP_bio_cb_t bio_update_fn, void *arg,
                                  int buf_size, int overall_timeout)
{
    BIO *cbio; /* == bio if supplied, used as connection BIO if rbio is NULL */
    OSSL_HTTP_REQ_CTX *rctx = NULL;

    if (use_ssl && bio_update_fn == NULL) {
        ERR_raise(ERR_LIB_HTTP, HTTP_R_TLS_NOT_ENABLED);
        return NULL;
    }
    if (rbio != NULL && (bio == NULL || bio_update_fn != NULL)) {
        ERR_raise(ERR_LIB_HTTP, ERR_R_PASSED_INVALID_ARGUMENT);
        return NULL;
    }

    if (bio != NULL) {
        cbio = bio;
        if (proxy != NULL || no_proxy != NULL) {
            ERR_raise(ERR_LIB_HTTP, ERR_R_PASSED_INVALID_ARGUMENT);
            return NULL;
        }
    } else {
#ifndef OPENSSL_NO_SOCK
        char *proxy_host = NULL, *proxy_port = NULL;

        if (server == NULL) {
            ERR_raise(ERR_LIB_HTTP, ERR_R_PASSED_NULL_PARAMETER);
            return NULL;
        }
        if (port != NULL && *port == '\0')
            port = NULL;
        if (port == NULL && strchr(server, ':') == NULL)
            port = use_ssl ? OSSL_HTTPS_PORT : OSSL_HTTP_PORT;
        proxy = OSSL_HTTP_adapt_proxy(proxy, no_proxy, server, use_ssl);
        if (proxy != NULL
            && !OSSL_HTTP_parse_url(proxy, NULL /* use_ssl */, NULL /* user */,
                                    &proxy_host, &proxy_port, NULL /* num */,
                                    NULL /* path */, NULL, NULL))
            return NULL;
        cbio = http_new_bio(server, port, use_ssl, proxy_host, proxy_port);
        OPENSSL_free(proxy_host);
        OPENSSL_free(proxy_port);
        if (cbio == NULL)
            return NULL;
#else
        ERR_raise(ERR_LIB_HTTP, HTTP_R_SOCK_NOT_SUPPORTED);
        return NULL;
#endif
    }

    (void)ERR_set_mark(); /* prepare removing any spurious libssl errors */
    if (rbio == NULL && BIO_do_connect_retry(cbio, overall_timeout, -1) <= 0) {
        if (bio == NULL) /* cbio was not provided by caller */
            BIO_free_all(cbio);
        goto end;
    }
    /* now overall_timeout is guaranteed to be >= 0 */

    /* callback can be used to wrap or prepend TLS session */
    if (bio_update_fn != NULL) {
        BIO *orig_bio = cbio;

        cbio = (*bio_update_fn)(cbio, arg, 1 /* connect */, use_ssl);
        if (cbio == NULL) {
            if (bio == NULL) /* cbio was not provided by caller */
                BIO_free_all(orig_bio);
            goto end;
        }
    }

    rctx = http_req_ctx_new(bio == NULL, cbio, rbio != NULL ? rbio : cbio,
                            bio_update_fn, arg, use_ssl, proxy, server, port,
                            buf_size, overall_timeout);

 end:
    if (rctx != NULL)
        /* remove any spurious error queue entries by ssl_add_cert_chain() */
        (void)ERR_pop_to_mark();
    else
        (void)ERR_clear_last_mark();

    return rctx;
}